

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *compilation,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  Expression *expr;
  byte bVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  AssertionInstanceExpression *pAVar9;
  SourceRange range;
  SourceRange range_00;
  bool bVar10;
  ExpressionKind EVar11;
  Type *pTVar12;
  Compilation *pCVar13;
  SourceLocation SVar14;
  Type *pTVar15;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar16;
  Diagnostic *pDVar17;
  InvalidExpression *pIVar18;
  AssertionInstanceExpression *this_00;
  InvocationExpressionSyntax *syntax;
  SourceLocation SVar19;
  long lVar20;
  Compilation *compilation_00;
  ulong offset;
  SourceRange range_01;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors_00;
  SourceRange SVar21;
  SourceRange range_02;
  SourceRange sourceRange_00;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange sourceRange_01;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  LookupResult nextResult;
  undefined1 in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd89;
  SourceLocation in_stack_fffffffffffffd90;
  SourceLocation local_260;
  SourceRange local_250;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  local_240;
  SourceRange local_230;
  undefined1 local_220 [8];
  undefined1 local_218 [13];
  undefined3 uStack_20b;
  undefined1 auStack_208 [16];
  size_type local_1f8;
  size_type local_1f0;
  bool local_1e8 [192];
  SmallVectorBase<slang::Diagnostic> local_128;
  
  SVar14 = sourceRange.endLoc;
  SVar21.startLoc = sourceRange.startLoc;
  this_00 = (AssertionInstanceExpression *)(compilation->super_BumpAllocator).head;
  local_250.startLoc = (SourceLocation)result;
  local_250.endLoc = SVar21.startLoc;
  if (this_00 == (AssertionInstanceExpression *)0x0) {
    local_218._0_8_ = (Compilation *)0x0;
    SVar14 = this[6].sourceRange.startLoc;
    goto LAB_0026303a;
  }
  range_01.endLoc = SVar21.startLoc;
  range_01.startLoc = (SourceLocation)result;
  syntax = invocation;
  if ((((ulong)(withClause->method).ptr & 4) != 0) &&
     (bVar10 = Symbol::isType((Symbol *)this_00), bVar10)) {
    SVar21.endLoc = (SourceLocation)withClause;
    pTVar12 = Type::fromLookupResult
                        ((Type *)this,compilation,result,SVar21,(ASTContext *)invocation);
    pCVar13 = (Compilation *)
              BumpAllocator::
              emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                        ((BumpAllocator *)this,pTVar12,&local_250);
    bVar10 = bad((Expression *)pCVar13);
    if (bVar10) {
      return (Expression *)pCVar13;
    }
    if (SVar14 == (SourceLocation)0x0) {
      if (syntax == (InvocationExpressionSyntax *)0x0) {
        return (Expression *)pCVar13;
      }
      SVar21 = parsing::Token::range((Token *)&syntax->attributes);
      ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x920007,SVar21);
    }
    else {
      sVar2 = ((string_view *)((long)SVar14 + 0x48))->_M_len;
      SVar14 = local_250.startLoc;
      if (sVar2 != 0) {
        SVar14 = parsing::Token::location((Token *)(sVar2 + 0x10));
      }
      pDVar17 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x4d0007,SVar14);
      range_00.endLoc = local_250.endLoc;
      range_00.startLoc = local_250.startLoc;
      Diagnostic::operator<<(pDVar17,range_00);
    }
    SVar14 = this[6].sourceRange.startLoc;
    local_218._0_8_ = pCVar13;
    goto LAB_0026303a;
  }
  if (SVar14 == (SourceLocation)0x0) {
LAB_00262b02:
    EVar11 = (this_00->super_Expression).kind;
  }
  else {
    EVar11 = (this_00->super_Expression).kind;
    if (EVar11 == (Dist|LValueReference)) {
      lVar20._0_4_ = (compilation->options).maxConstexprBacktrace;
      lVar20._4_4_ = (compilation->options).maxDefParamSteps;
      if ((((lVar20 == 0) &&
           (SVar19 = (this_00->super_Expression).sourceRange.startLoc, SVar19 != (SourceLocation)0x0
           )) && (pAVar9 = *(AssertionInstanceExpression **)((long)SVar19 + 8),
                 (pAVar9->super_Expression).kind == (Dist|EmptyArgument))) &&
         ((*(AssertionInstanceExpression **)&pAVar9[1].isRecursiveProperty == this_00 &&
          (this_00 = pAVar9, *(int *)((long)&pAVar9[1].arguments.size_ + 4) != 0)))) {
        assert::assertFailed
                  ("scope->asSymbol().as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                   ,0x3ba,
                   "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                  );
      }
      goto LAB_00262b02;
    }
  }
  local_260 = SVar14;
  if ((int)EVar11 < 0x4d) {
    if (EVar11 == (Dist|EmptyArgument)) {
      lVar4._0_4_ = (compilation->options).maxConstexprBacktrace;
      lVar4._4_4_ = (compilation->options).maxDefParamSteps;
      if (lVar4 != 0) {
        assert::assertFailed
                  ("result.selectors.empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                   ,0x3c2,
                   "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                  );
      }
      if ((SVar14 != (SourceLocation)0x0) &&
         (range_01 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar14),
         (this_00->super_Expression).kind != (Dist|EmptyArgument))) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::SubroutineSymbol]");
      }
      local_1e8[0] = false;
      local_230.endLoc = range_01.endLoc;
      in_stack_fffffffffffffd88 = range_01.startLoc._0_1_;
      in_stack_fffffffffffffd89 = range_01.startLoc._1_7_;
      local_260 = (SourceLocation)0x0;
      in_stack_fffffffffffffd90 = local_230.endLoc;
      local_230 = range_01;
      local_218._0_8_ = this_00;
      pCVar13 = (Compilation *)
                CallExpression::fromLookup
                          ((CallExpression *)this,(Compilation *)local_218,(Subroutine *)0x0,
                           (Expression *)SVar14,syntax,withClause,range_01,(ASTContext *)syntax);
      syntax = (InvocationExpressionSyntax *)0x0;
    }
    else {
      if (EVar11 == 0x46) {
        lVar7._0_4_ = (compilation->options).maxConstexprBacktrace;
        lVar7._4_4_ = (compilation->options).maxDefParamSteps;
        SVar14._1_7_ = 0;
        SVar14._0_1_ = lVar7 != 0;
        bVar1 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
      }
      else {
LAB_00262bef:
        bVar1 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
        SVar14 = (SourceLocation)0x0;
      }
      sourceRange_00.endLoc = SVar14;
      sourceRange_00.startLoc = SVar21.startLoc;
      pCVar13 = (Compilation *)
                ValueExpressionBase::fromSymbol
                          ((ValueExpressionBase *)withClause,(ASTContext *)this_00,
                           (Symbol *)(ulong)bVar1,SUB81(result,0),sourceRange_00,
                           (bool)in_stack_fffffffffffffd88);
    }
  }
  else {
    if (1 < EVar11 - 0x4d) {
      if (EVar11 == 0x4f) {
        range_02.endLoc = (SourceLocation)withClause;
        range_02.startLoc = SVar21.startLoc;
        pCVar13 = (Compilation *)
                  AssertionInstanceExpression::bindPort
                            (this_00,(Symbol *)result,range_02,(ASTContext *)SVar14);
        goto LAB_00262cb4;
      }
      if (EVar11 != 0x53) goto LAB_00262bef;
    }
    lVar3._0_4_ = (compilation->options).maxConstexprBacktrace;
    lVar3._4_4_ = (compilation->options).maxDefParamSteps;
    SVar19 = (SourceLocation)0x0;
    if (lVar3 == 0) {
      SVar19 = SVar14;
      SVar14 = (SourceLocation)0x0;
    }
    range_04.endLoc = (SourceLocation)withClause;
    range_04.startLoc = SVar21.startLoc;
    pCVar13 = (Compilation *)
              AssertionInstanceExpression::fromLookup
                        (this_00,(Symbol *)SVar19,(InvocationExpressionSyntax *)result,range_04,
                         (ASTContext *)invocation);
    local_260 = SVar14;
    if (((this_00->super_Expression).kind == 0x53) &&
       (*(char *)((long)&(compilation->options).maxInstanceDepth + 1) == '\x01')) {
      if (SVar19 != (SourceLocation)0x0) {
        range_01 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar19);
      }
      ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x5b0007,range_01);
    }
  }
LAB_00262cb4:
  lVar5._0_4_ = (compilation->options).maxConstexprBacktrace;
  lVar5._4_4_ = (compilation->options).maxDefParamSteps;
  if (lVar5 != 0) {
    lVar20 = 0;
    offset = 0;
    do {
      bVar10 = bad((Expression *)pCVar13);
      if (bVar10) {
        return (Expression *)pCVar13;
      }
      uVar6._0_4_ = (compilation->options).maxConstexprBacktrace;
      uVar6._4_4_ = (compilation->options).maxDefParamSteps;
      if (uVar6 <= offset) {
        assert::assertFailed
                  ("index < len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                   ,0x196,
                   "reference slang::SmallVectorBase<std::variant<const slang::syntax::ElementSelectSyntax *, slang::ast::LookupResult::MemberSelector>>::operator[](size_type) [T = std::variant<const slang::syntax::ElementSelectSyntax *, slang::ast::LookupResult::MemberSelector>]"
                  );
      }
      lVar7 = *(long *)&(compilation->options).maxConstexprDepth;
      expr = (Expression *)(lVar7 + lVar20);
      if ((lVar7 == 0) || (*(char *)(lVar7 + 0x28 + lVar20) != '\x01')) {
        ppEVar16 = std::
                   get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                             ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               *)expr);
        pCVar13 = (Compilation *)
                  bindSelector((Compilation *)this,(Expression *)pCVar13,*ppEVar16,
                               (ASTContext *)withClause);
      }
      else {
        pTVar12 = (Type *)(pCVar13->super_BumpAllocator).endPtr;
        if (pTVar12 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        pTVar15 = pTVar12->canonical;
        if (pTVar15 == (Type *)0x0) {
          Type::resolveCanonical(pTVar12);
          pTVar15 = pTVar12->canonical;
        }
        if ((pTVar15->super_Symbol).kind == VirtualInterfaceType) {
          local_218._0_8_ = (Symbol *)0x0;
          local_218._8_5_ = 0;
          uStack_20b = 0;
          auStack_208._0_5_ = 0;
          local_1f8 = 0;
          local_1f0 = 4;
          local_128.data_ = (pointer)local_128.firstElement;
          local_128.len = 0;
          local_128.cap = 2;
          local_240.data_ = *(pointer *)&(compilation->options).maxConstexprDepth;
          local_240.size_._0_4_ = (compilation->options).maxConstexprBacktrace;
          local_240.size_._4_4_ = (compilation->options).maxDefParamSteps;
          pTVar12 = (Type *)(pCVar13->super_BumpAllocator).endPtr;
          auStack_208._8_8_ = (pointer)local_1e8;
          if (pTVar12 == (Type *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                      );
          }
          range.startLoc._0_4_ = (pCVar13->options).maxConstexprBacktrace;
          range.startLoc._4_4_ = (pCVar13->options).maxDefParamSteps;
          range.endLoc._0_4_ = (pCVar13->options).maxInstanceArray;
          range.endLoc._4_4_ = (pCVar13->options).errorLimit;
          selectors_00 = nonstd::span_lite::
                         span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                         ::subspan(&local_240,offset,0xffffffffffffffff);
          Lookup::selectChild(pTVar12,range,selectors_00,(ASTContext *)withClause,
                              (LookupResult *)local_218);
          LookupResult::reportDiags((LookupResult *)local_218,(ASTContext *)withClause);
          if ((Symbol *)local_218._0_8_ == (Symbol *)0x0) {
            compilation_00 = (Compilation *)local_220;
            local_220 = (undefined1  [8])pCVar13;
            pIVar18 = BumpAllocator::
                      emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                                ((BumpAllocator *)this,(Expression **)compilation_00,
                                 (Type *)this[6].sourceRange.startLoc);
          }
          else {
            compilation_00 = (Compilation *)local_218;
            sourceRange_01.endLoc = local_260;
            sourceRange_01.startLoc = local_250.endLoc;
            pIVar18 = (InvalidExpression *)
                      bindLookupResult(this,compilation_00,(LookupResult *)local_250.startLoc,
                                       sourceRange_01,syntax,withClause,
                                       (ASTContext *)in_stack_fffffffffffffd90);
          }
          SmallVectorBase<slang::Diagnostic>::cleanup(&local_128,(EVP_PKEY_CTX *)compilation_00);
          if ((pointer)auStack_208._8_8_ == (pointer)local_1e8) {
            return &pIVar18->super_Expression;
          }
          free((void *)auStack_208._8_8_);
          return &pIVar18->super_Expression;
        }
        if (offset == *(long *)&(compilation->options).maxConstexprBacktrace - 1U) {
          pCVar13 = (Compilation *)
                    MemberAccessExpression::fromSelector
                              ((MemberAccessExpression *)this,pCVar13,expr,
                               (MemberSelector *)local_260,syntax,withClause,
                               (ASTContext *)
                               CONCAT71(in_stack_fffffffffffffd89,in_stack_fffffffffffffd88));
          if (*(ExpressionKind *)&(pCVar13->super_BumpAllocator).head == Call) {
            local_260 = (SourceLocation)0x0;
            syntax = (InvocationExpressionSyntax *)0x0;
          }
        }
        else {
          pCVar13 = (Compilation *)
                    MemberAccessExpression::fromSelector
                              ((MemberAccessExpression *)this,pCVar13,expr,(MemberSelector *)0x0,
                               (InvocationExpressionSyntax *)0x0,withClause,
                               (ASTContext *)
                               CONCAT71(in_stack_fffffffffffffd89,in_stack_fffffffffffffd88));
        }
      }
      offset = offset + 1;
      lVar20 = lVar20 + 0x30;
      uVar8._0_4_ = (compilation->options).maxConstexprBacktrace;
      uVar8._4_4_ = (compilation->options).maxDefParamSteps;
    } while (offset < uVar8);
  }
  bVar10 = bad((Expression *)pCVar13);
  if (bVar10) {
    return (Expression *)pCVar13;
  }
  if (local_260 == (SourceLocation)0x0) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      return (Expression *)pCVar13;
    }
    SVar21 = parsing::Token::range((Token *)&syntax->attributes);
    ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x920007,SVar21);
  }
  else {
    sVar2 = ((string_view *)((long)local_260 + 0x48))->_M_len;
    SVar14 = local_250.startLoc;
    if (sVar2 != 0) {
      SVar14 = parsing::Token::location((Token *)(sVar2 + 0x10));
    }
    SVar19 = local_250.startLoc;
    pDVar17 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x4d0007,SVar14);
    range_03.endLoc = local_250.endLoc;
    range_03.startLoc = SVar19;
    Diagnostic::operator<<(pDVar17,range_03);
  }
  SVar14 = this[6].sourceRange.startLoc;
  local_218._0_8_ = pCVar13;
LAB_0026303a:
  pIVar18 = BumpAllocator::
            emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                      ((BumpAllocator *)this,(Expression **)local_218,(Type *)SVar14);
  return &pIVar18->super_Expression;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& compilation, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(compilation, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(compilation, result, sourceRange, context);
        auto expr = compilation.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(compilation, expr);

        return *expr;
    }

    // Recursive function call
    if (invocation && symbol->kind == SymbolKind::Variable && result.selectors.empty()) {
        // TODO: check nested scopes?
        auto scope = symbol->getParentScope();
        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine &&
            scope->asSymbol().as<SubroutineSymbol>().returnValVar == symbol) {
            ASSERT(scope->asSymbol().as<SubroutineSymbol>().subroutineKind ==
                   SubroutineKind::Function);
            symbol = &scope->asSymbol();
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(compilation, &symbol->as<SubroutineSymbol>(),
                                               nullptr, invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl && result.isHierarchical) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            bool constraintAllowed = !result.selectors.empty();
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange, constraintAllowed);
            break;
        }
        default:
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange);
            break;
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        if (expr->bad())
            return *expr;

        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(compilation, expr);

                return bindLookupResult(compilation, nextResult, sourceRange, invocation,
                                        withClause, context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             invocation, withClause, context);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             nullptr, nullptr, context);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(compilation, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(compilation, expr);

    return *expr;
}